

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineQueryResultDocument.h
# Opt level: O0

void __thiscall
TgBot::InlineQueryResultDocument::InlineQueryResultDocument(InlineQueryResultDocument *this)

{
  InlineQueryResultDocument *this_local;
  
  InlineQueryResult::InlineQueryResult(&this->super_InlineQueryResult);
  (this->super_InlineQueryResult)._vptr_InlineQueryResult =
       (_func_int **)&PTR__InlineQueryResultDocument_0051b200;
  std::__cxx11::string::string((string *)&this->documentUrl);
  std::__cxx11::string::string((string *)&this->mimeType);
  std::__cxx11::string::string((string *)&this->description);
  std::__cxx11::string::string((string *)&this->thumbUrl);
  std::__cxx11::string::operator=
            ((string *)&(this->super_InlineQueryResult).type,(string *)&TYPE_abi_cxx11_);
  this->thumbHeight = 0;
  this->thumbWidth = 0;
  return;
}

Assistant:

InlineQueryResultDocument() {
        this->type = TYPE;
        this->thumbHeight = 0;
        this->thumbWidth = 0;
    }